

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Setup(BasicInputBase *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)this->expected_data[0].m_data + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x400);
  this->instance_count = 1;
  this->base_instance = -1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i			 = 0; i < 64; ++i)
			expected_data[i] = Vec4(0.0f);
		instance_count		 = 1;
		base_instance		 = -1;
		return NO_ERROR;
	}